

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

void get_msurf_descriptor(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint *in_RSI;
  undefined8 in_RDI;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int i_1;
  float norm_factor;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  int sample_y;
  int sample_x;
  int l;
  int k;
  int ys;
  int xs;
  float mdy;
  float mdx;
  float dy;
  float dx;
  int j;
  int i;
  float cy;
  float cx;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int ipoint_y;
  int ipoint_x;
  float scale;
  undefined8 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int local_88;
  int local_60;
  int local_5c;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  int local_40;
  int local_3c;
  uint local_30;
  int local_2c;
  
  fVar1 = (float)in_RSI[2];
  dVar8 = std::round((double)(ulong)*in_RSI);
  dVar9 = std::round((double)(ulong)in_RSI[1]);
  local_2c = 0;
  local_30 = 0;
  for (local_3c = -8; local_3c < 0xc; local_3c = local_3c + 5) {
    for (local_40 = -8; local_40 < 0xc; local_40 = local_40 + 5) {
      local_44 = 0.0;
      local_48 = 0.0;
      local_4c = 0.0;
      local_50 = 0.0;
      auVar27._0_8_ = (double)(int)SUB84(dVar8,0);
      auVar27._8_8_ = 0;
      auVar11._0_8_ = (double)fVar1;
      auVar11._8_8_ = 0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (double)(local_3c + -4) + 4.5;
      auVar11 = vfmadd213sd_fma(auVar11,auVar15,auVar27);
      auVar31._8_8_ = 0x8000000000000000;
      auVar31._0_8_ = 0x8000000000000000;
      auVar16._8_8_ = 0x3fdfffffffffffff;
      auVar16._0_8_ = 0x3fdfffffffffffff;
      auVar4 = vpternlogq_avx512vl(auVar16,auVar11,auVar31,0xf8);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar11._0_8_ + auVar4._0_8_;
      auVar11 = vroundsd_avx(auVar11,auVar17,0xb);
      auVar28._0_8_ = (double)(int)SUB84(dVar9,0);
      auVar4._8_8_ = auVar11._8_8_;
      auVar28._8_8_ = auVar4._8_8_;
      auVar4._0_8_ = (double)fVar1;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (double)(local_40 + -4) + 4.5;
      auVar11 = vfmadd213sd_fma(auVar4,auVar18,auVar28);
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar19._8_8_ = 0x3fdfffffffffffff;
      auVar19._0_8_ = 0x3fdfffffffffffff;
      auVar4 = vpternlogq_avx512vl(auVar19,auVar11,auVar32,0xf8);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar11._0_8_ + auVar4._0_8_;
      auVar11 = vroundsd_avx(auVar11,auVar20,0xb);
      auVar14 = ZEXT1664(auVar11);
      for (local_5c = local_3c + -4; local_60 = local_40 + -4, local_5c < local_3c + 5;
          local_5c = local_5c + 1) {
        for (; local_60 < local_40 + 5; local_60 = local_60 + 1) {
          auVar29._0_8_ = (double)(int)SUB84(dVar8,0);
          auVar12._8_8_ = auVar14._8_8_;
          auVar29._8_8_ = auVar12._8_8_;
          auVar12._0_8_ = (double)fVar1;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = (double)local_5c + 0.5;
          auVar11 = vfmadd213sd_fma(auVar12,auVar21,auVar29);
          auVar33._8_8_ = 0x8000000000000000;
          auVar33._0_8_ = 0x8000000000000000;
          auVar22._8_8_ = 0x3fdfffffffffffff;
          auVar22._0_8_ = 0x3fdfffffffffffff;
          auVar4 = vpternlogq_avx512vl(auVar22,auVar11,auVar33,0xf8);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = auVar11._0_8_ + auVar4._0_8_;
          auVar11 = vroundsd_avx(auVar11,auVar23,0xb);
          fVar2 = (float)(int)auVar11._0_8_;
          auVar30._0_8_ = (double)(int)SUB84(dVar9,0);
          auVar13._8_8_ = auVar11._8_8_;
          auVar30._8_8_ = auVar13._8_8_;
          auVar13._0_8_ = (double)fVar1;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = (double)local_60 + 0.5;
          auVar11 = vfmadd213sd_fma(auVar13,auVar24,auVar30);
          auVar34._8_8_ = 0x8000000000000000;
          auVar34._0_8_ = 0x8000000000000000;
          auVar25._8_8_ = 0x3fdfffffffffffff;
          auVar25._0_8_ = 0x3fdfffffffffffff;
          auVar4 = vpternlogq_avx512vl(auVar25,auVar11,auVar34,0xf8);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = auVar11._0_8_ + auVar4._0_8_;
          auVar11 = vroundsd_avx(auVar11,auVar26,0xb);
          fVar3 = (float)(int)auVar11._0_8_;
          fVar5 = gaussian(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                           (float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          in_stack_ffffffffffffff60 = fVar3;
          in_stack_ffffffffffffff64 = fVar2;
          std::round((double)(ulong)(uint)fVar1);
          fVar6 = haarX((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68,(int)in_stack_ffffffffffffff64);
          in_stack_ffffffffffffff68 = in_RDI;
          std::round((double)(ulong)(uint)fVar1);
          fVar7 = haarY((integral_image *)CONCAT44(fVar2,fVar3),
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68,(int)in_stack_ffffffffffffff64);
          local_44 = fVar5 * fVar7 + local_44;
          local_48 = fVar5 * fVar6 + local_48;
          dVar10 = std::fabs((double)(ulong)(uint)(fVar5 * fVar7));
          local_4c = SUB84(dVar10,0) + local_4c;
          dVar10 = std::fabs((double)(ulong)(uint)(fVar5 * fVar6));
          local_50 = SUB84(dVar10,0) + local_50;
          auVar14 = ZEXT464((uint)local_50);
          in_stack_ffffffffffffff58 = in_RDI;
          in_stack_ffffffffffffff70 = fVar3;
          in_stack_ffffffffffffff74 = fVar2;
        }
      }
      fVar2 = gaussian(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                       (float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      in_RSI[(long)local_2c + 5] = (uint)(local_44 * fVar2);
      in_RSI[(long)(local_2c + 1) + 5] = (uint)(local_48 * fVar2);
      in_RSI[(long)(local_2c + 2) + 5] = (uint)(local_4c * fVar2);
      in_RSI[(long)(local_2c + 3) + 5] = (uint)(local_50 * fVar2);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)local_44),
                                ZEXT416((uint)(local_48 * local_48)));
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)local_4c),ZEXT416((uint)local_4c),auVar11);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)local_50),ZEXT416((uint)local_50),auVar11);
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(auVar11._0_4_ * fVar2)),
                                ZEXT416(local_30));
      local_30 = auVar11._0_4_;
      local_2c = local_2c + 4;
    }
  }
  dVar8 = std::sqrt((double)(ulong)local_30);
  for (local_88 = 0; local_88 < 0x40; local_88 = local_88 + 1) {
    in_RSI[(long)local_88 + 5] = (uint)((1.0 / SUB84(dVar8,0)) * (float)in_RSI[(long)local_88 + 5]);
  }
  return;
}

Assistant:

void get_msurf_descriptor(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int ipoint_x = (int) round(ipoint->x);
    int ipoint_y = (int) round(ipoint->y);

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -0.5f;
    float cy = 0.0f;

    //float co = 1;
    //float si = 0;

    int i = -8;

    // calculate descriptor for this interest point
    while(i < 12) {

        int j = -8;
        i = i - 4;

        cx += 1.0f; // 4 x Add
        cy = -0.5f;

        while(j < 12) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            cy += 1.0f; // 16 x Add

            j = j - 4;

            //int xs = (int) round(ipoint_x + ( -jx*scale*si + ix*scale*co));
            //int ys = (int) round(ipoint_y + ( jx*scale*co + ix*scale*si));
            // TODO: (Sebastian) I think this should be i + 4 and j + 4 (OpenSURF also wrong)
            //int xs = (int) round(ipoint_x + (i + 5) * scale);
            //int ys = (int) round(ipoint_y + (j + 5) * scale);
            int xs = (int) round(ipoint_x + (i + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int
            int ys = (int) round(ipoint_y + (j + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int

            for (int k = i; k < i + 9; ++k) {
                for (int l = j; l < j + 9; ++l) {

                    //Get coords of sample point on the rotated axis
                    //int sample_x = (int) round(ipoint_x + (-l*scale*si + k*scale*co));
                    //int sample_y = (int) round(ipoint_y + ( l*scale*co + k*scale*si));
                    int sample_x = (int) round(ipoint_x + (k+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int
                    int sample_y = (int) round(ipoint_y + (l+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int

                    float gauss_s1 = gaussian((float) xs-sample_x, (float) ys-sample_y, 2.5f * scale); // 81*32 x int->float + 81*16 x Mul + 81*16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 81*32 x int->float + 81*16*9 Mul + 81*16*2 Div + 81*16 Add + 81*16 Exp
                                        
                    float rx = haarX(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarX(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    float ry = haarY(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarY(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x,sample_y,(int)round(scale),rx,ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    //float rrx = gauss_s1*(-rx*si + ry*co);
                    //float rry = gauss_s1*(rx*co + ry*si);
                    // TODO: (Sebastian) This seems weird...
                    float rrx = gauss_s1 * (ry); // 81*16 x Mul
                    float rry = gauss_s1 * (rx); // 81*16 x Mul

                    dx += rrx; // 81*16 x add
                    dy += rry; // 81*16 x add
                    mdx += (float) fabs(rrx); // 81*16 x add + 81*16 x fabs
                    mdy += (float) fabs(rry); // 81*16 x add + 81*16 x fabs

                }      
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussian(cx-2.0f, cy-2.0f, 1.5f); // 32 x add + 16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 48 add + 16*8 mul + 32 div + 16 exp

            // add the values to the descriptor vector
            descriptor[desc_idx] = dx * gauss_s2; // 16 x mul
            descriptor[desc_idx+1] = dy * gauss_s2; // 16 x mul
            descriptor[desc_idx+2] = mdx * gauss_s2; // 16 x mul
            descriptor[desc_idx+3] = mdy * gauss_s2; // 16 x mul

            // precompute for normaliztion
            sum_of_squares += (dx*dx + dy*dy + mdx*mdx + mdy*mdy) * gauss_s2*gauss_s2; // 6*16 x mul + 3*16 x add

            desc_idx += 4;

            j += 9;

        }

        i += 9;

    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrt(sum_of_squares); // 1 x div + 1 x sqrt

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor; // 64 x mul
    }

}